

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000005d2ec0 = 0x2d2d2d2d2d2d2d;
    uRam00000000005d2ec7._0_1_ = '-';
    uRam00000000005d2ec7._1_1_ = '-';
    uRam00000000005d2ec7._2_1_ = '-';
    uRam00000000005d2ec7._3_1_ = '-';
    uRam00000000005d2ec7._4_1_ = '-';
    uRam00000000005d2ec7._5_1_ = '-';
    uRam00000000005d2ec7._6_1_ = '-';
    uRam00000000005d2ec7._7_1_ = '-';
    DAT_005d2eb0 = '-';
    DAT_005d2eb0_1._0_1_ = '-';
    DAT_005d2eb0_1._1_1_ = '-';
    DAT_005d2eb0_1._2_1_ = '-';
    DAT_005d2eb0_1._3_1_ = '-';
    DAT_005d2eb0_1._4_1_ = '-';
    DAT_005d2eb0_1._5_1_ = '-';
    DAT_005d2eb0_1._6_1_ = '-';
    uRam00000000005d2eb8 = 0x2d2d2d2d2d2d2d;
    DAT_005d2ebf = 0x2d;
    DAT_005d2ea0 = '-';
    DAT_005d2ea0_1._0_1_ = '-';
    DAT_005d2ea0_1._1_1_ = '-';
    DAT_005d2ea0_1._2_1_ = '-';
    DAT_005d2ea0_1._3_1_ = '-';
    DAT_005d2ea0_1._4_1_ = '-';
    DAT_005d2ea0_1._5_1_ = '-';
    DAT_005d2ea0_1._6_1_ = '-';
    uRam00000000005d2ea8._0_1_ = '-';
    uRam00000000005d2ea8._1_1_ = '-';
    uRam00000000005d2ea8._2_1_ = '-';
    uRam00000000005d2ea8._3_1_ = '-';
    uRam00000000005d2ea8._4_1_ = '-';
    uRam00000000005d2ea8._5_1_ = '-';
    uRam00000000005d2ea8._6_1_ = '-';
    uRam00000000005d2ea8._7_1_ = '-';
    DAT_005d2e90 = '-';
    DAT_005d2e90_1._0_1_ = '-';
    DAT_005d2e90_1._1_1_ = '-';
    DAT_005d2e90_1._2_1_ = '-';
    DAT_005d2e90_1._3_1_ = '-';
    DAT_005d2e90_1._4_1_ = '-';
    DAT_005d2e90_1._5_1_ = '-';
    DAT_005d2e90_1._6_1_ = '-';
    uRam00000000005d2e98._0_1_ = '-';
    uRam00000000005d2e98._1_1_ = '-';
    uRam00000000005d2e98._2_1_ = '-';
    uRam00000000005d2e98._3_1_ = '-';
    uRam00000000005d2e98._4_1_ = '-';
    uRam00000000005d2e98._5_1_ = '-';
    uRam00000000005d2e98._6_1_ = '-';
    uRam00000000005d2e98._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000005d2e88._0_1_ = '-';
    uRam00000000005d2e88._1_1_ = '-';
    uRam00000000005d2e88._2_1_ = '-';
    uRam00000000005d2e88._3_1_ = '-';
    uRam00000000005d2e88._4_1_ = '-';
    uRam00000000005d2e88._5_1_ = '-';
    uRam00000000005d2e88._6_1_ = '-';
    uRam00000000005d2e88._7_1_ = '-';
    DAT_005d2ecf = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}